

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O0

int __thiscall
cubeb_mixer::mix(cubeb_mixer *this,size_t frames,void *input_buffer,size_t input_buffer_size,
                void *output_buffer,size_t output_buffer_size)

{
  cubeb_sample_format cVar1;
  bool bVar2;
  size_t sVar3;
  cubeb_mixer *this_00;
  cubeb_mixer *in_RCX;
  float *output_buffer_00;
  anon_class_1_0_00000001 *in_RDX;
  int (*in_RSI) [32] [32];
  cubeb_mixer *in_RDI;
  anon_class_1_0_00000001 *in_R8;
  long in_R9;
  MixerContext *unaff_retaddr;
  anon_class_1_0_00000001 f_2;
  anon_class_1_0_00000001 f_1;
  anon_class_1_0_00000001 f;
  size_t size_read_needed;
  size_t in_stack_ffffffffffffffb8;
  uint32_t frames_00;
  cubeb_mixer *s;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  if ((in_RSI == (int (*) [32] [32])0x0) || ((in_RDI->_context)._out_ch_count == 0)) {
    iVar4 = 0;
  }
  else {
    output_buffer_00 = (float *)((long)in_RSI * (ulong)(in_RDI->_context)._in_ch_count);
    s = in_RDI;
    sVar3 = cubeb_sample_size((in_RDI->_context)._format);
    this_00 = (cubeb_mixer *)((long)output_buffer_00 * sVar3);
    if (in_RCX < this_00) {
      iVar4 = -1;
    }
    else if (in_R9 * (ulong)(in_RDI->_context)._in_ch_count <
             (long)this_00 * (ulong)(in_RDI->_context)._out_ch_count) {
      iVar4 = -1;
    }
    else {
      bVar2 = valid(in_RDI);
      if (bVar2) {
        cVar1 = (in_RDI->_context)._format;
        if (cVar1 == CUBEB_SAMPLE_S16LE) {
          frames_00 = (uint32_t)((ulong)in_RCX >> 0x20);
          if (((in_RDI->_context)._clipping & 1U) == 0) {
            iVar4 = rematrix<short,int,32ul,cubeb_mixer::mix(unsigned_long,void_const*,unsigned_long,void*,unsigned_long)const::_lambda(int)_2_&>
                              (unaff_retaddr,
                               (short *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                ),(short *)s,in_RSI,in_RDX,frames_00);
          }
          else {
            iVar4 = rematrix<short,int,32ul,cubeb_mixer::mix(unsigned_long,void_const*,unsigned_long,void*,unsigned_long)const::_lambda(int)_1_&>
                              (unaff_retaddr,
                               (short *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                ),(short *)s,in_RSI,in_RDX,frames_00);
          }
        }
        else if (cVar1 == CUBEB_SAMPLE_FLOAT32LE) {
          iVar4 = rematrix<float,float,32ul,cubeb_mixer::mix(unsigned_long,void_const*,unsigned_long,void*,unsigned_long)const::_lambda(float)_1_&>
                            ((MixerContext *)s,(float *)in_RSI,(float *)in_RDX,
                             (float (*) [32] [32])in_RCX,in_R8,(uint32_t)((ulong)in_R9 >> 0x20));
        }
        else {
          iVar4 = -1;
        }
      }
      else {
        if ((in_RDI->_context)._format == CUBEB_SAMPLE_FLOAT32LE) {
          copy_and_trunc<float>(this_00,in_stack_ffffffffffffffb8,(float *)in_RDI,output_buffer_00);
        }
        else {
          copy_and_trunc<short>
                    (this_00,in_stack_ffffffffffffffb8,(short *)in_RDI,(short *)output_buffer_00);
        }
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int mix(size_t frames, const void * input_buffer, size_t input_buffer_size,
          void * output_buffer, size_t output_buffer_size) const
  {
    if (frames <= 0 || _context._out_ch_count == 0) {
      return 0;
    }

    // Check if output buffer is of sufficient size.
    size_t size_read_needed =
        frames * _context._in_ch_count * cubeb_sample_size(_context._format);
    if (input_buffer_size < size_read_needed) {
      // We don't have enough data to read!
      return -1;
    }
    if (output_buffer_size * _context._in_ch_count <
        size_read_needed * _context._out_ch_count) {
      return -1;
    }

    if (!valid()) {
      // The channel layouts were invalid or unsupported, instead we will simply
      // either drop the extra channels, or fill with silence the missing ones
      if (_context._format == CUBEB_SAMPLE_FLOAT32NE) {
        copy_and_trunc(frames, static_cast<const float *>(input_buffer),
                       static_cast<float *>(output_buffer));
      } else {
        assert(_context._format == CUBEB_SAMPLE_S16NE);
        copy_and_trunc(frames, static_cast<const int16_t *>(input_buffer),
                       reinterpret_cast<int16_t *>(output_buffer));
      }
      return 0;
    }

    switch (_context._format) {
    case CUBEB_SAMPLE_FLOAT32NE: {
      auto f = [](float x) { return x; };
      return rematrix(&_context, static_cast<float *>(output_buffer),
                      static_cast<const float *>(input_buffer),
                      _context._matrix_flt, f, frames);
    }
    case CUBEB_SAMPLE_S16NE:
      if (_context._clipping) {
        auto f = [](int x) {
          int y = (x + 16384) >> 15;
          // clip the signed integer value into the -32768,32767 range.
          if ((y + 0x8000U) & ~0xFFFF) {
            return (y >> 31) ^ 0x7FFF;
          }
          return y;
        };
        return rematrix(&_context, static_cast<int16_t *>(output_buffer),
                        static_cast<const int16_t *>(input_buffer),
                        _context._matrix32, f, frames);
      } else {
        auto f = [](int x) { return (x + 16384) >> 15; };
        return rematrix(&_context, static_cast<int16_t *>(output_buffer),
                        static_cast<const int16_t *>(input_buffer),
                        _context._matrix32, f, frames);
      }
      break;
    default:
      assert(false);
      break;
    }

    return -1;
  }